

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

db_bit * __thiscall lan::db::read_array_bit(db *this,string *name,string *content)

{
  bool bVar1;
  db_bit *pdVar2;
  logic_error *this_00;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  db_bit *local_28;
  db_bit *bit;
  string *content_local;
  string *name_local;
  db *this_local;
  
  bit = (db_bit *)content;
  content_local = name;
  name_local = (string *)this;
  pdVar2 = (db_bit *)operator_new(0x50);
  db_bit::db_bit(pdVar2);
  local_28 = pdVar2;
  std::__cxx11::string::operator=((string *)pdVar2,(string *)name);
  local_28->type = Array;
  local_28->data = (void *)0x0;
  pop_next(&local_58,this,&bit->key);
  bVar1 = std::operator!=(&local_58,"[");
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    pdVar2 = get_array_data(this,&bit->key);
    local_28->lin = pdVar2;
    return local_28;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  pop_next(&local_d8,this,&bit->key);
  std::operator+(&local_b8,"LANDB (pull_error): landb: expected <[> before <",&local_d8);
  std::operator+(&local_98,&local_b8,"> ... ");
  pop_next(&local_f8,this,&bit->key);
  std::operator+(&local_78,&local_98,&local_f8);
  std::logic_error::logic_error(this_00,(string *)&local_78);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

lan::db_bit * db::read_array_bit(std::string const name, std::string & content){
            db_bit * bit = new db_bit;
            bit->key = name;
            bit->type = Array;
            bit->data = nullptr;
            if(pop_next(content) != "[")
                throw lan::errors::pull_error ("LANDB (pull_error): landb: expected <[> before <" + pop_next(content) + "> ... " + pop_next(content));
            else
                bit->lin = get_array_data(content);
            return bit;
        }